

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O1

size_t pgi::num_out_edge_configurations(vertex_t v,PolicyGraph *g)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = steps_remaining(v,g);
  sVar2 = 1;
  if (1 < uVar1) {
    sVar3 = num_possible_successors(v,g);
    auVar5._8_4_ = (int)(sVar3 >> 0x20);
    auVar5._0_8_ = sVar3;
    auVar5._12_4_ = 0x45300000;
    sVar2 = ((g->m_property).px)->num_observations_;
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    dVar4 = pow((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0),
                (auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    sVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  }
  return sVar2;
}

Assistant:

std::size_t num_out_edge_configurations(vertex_t v, const PolicyGraph& g) {
  const std::size_t s = steps_remaining(v, g);
  if (s <= 1)
    return 1;
  else
    return std::pow(num_possible_successors(v, g),
                    g[boost::graph_bundle].num_observations_);
}